

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataRefs.cpp
# Opt level: O2

bool __thiscall DataRefs::SaveConfigFile(DataRefs *this)

{
  pointer pbVar1;
  pointer pCVar2;
  int *piVar3;
  ostream *poVar4;
  bool bVar5;
  string *s;
  long lVar6;
  pointer pbVar7;
  char *pcVar8;
  size_t i;
  pointer pCVar9;
  string sFileName;
  char sErr [100];
  ofstream fOut;
  byte abStack_210 [480];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fOut,"Output/preferences/LiveTraffic.prf",(allocator<char> *)sErr);
  LTCalcFullPath(&sFileName,(string *)&fOut);
  std::__cxx11::string::~string((string *)&fOut);
  std::ofstream::ofstream(&fOut,(string *)&sFileName,_S_trunc|_S_out);
  if ((abStack_210[*(long *)(_fOut + -0x18)] & 5) == 0) {
    poVar4 = std::operator<<((ostream *)&fOut,"LiveTraffic");
    poVar4 = std::operator<<(poVar4,' ');
    poVar4 = std::operator<<(poVar4,LT_VERSION);
    std::operator<<(poVar4,'\n');
    for (lVar6 = 0; lVar6 != 0x29a0; lVar6 = lVar6 + 0x60) {
      if ((&DATA_REFS_LT[0].bCfgFile)[lVar6] == true) {
        dataRefDefinitionT::GetConfigString_abi_cxx11_
                  ((string *)sErr,
                   (dataRefDefinitionT *)((long)&DATA_REFS_LT[0].dataName._M_dataplus._M_p + lVar6))
        ;
        poVar4 = std::operator<<((ostream *)&fOut,(string *)sErr);
        std::operator<<(poVar4,'\n');
        std::__cxx11::string::~string((string *)sErr);
      }
    }
    poVar4 = std::operator<<((ostream *)&fOut,"MessageWndPos");
    poVar4 = std::operator<<(poVar4,' ');
    poVar4 = operator<<(poVar4,&this->MsgRect);
    std::operator<<(poVar4,'\n');
    poVar4 = std::operator<<((ostream *)&fOut,"SettingsWndPos");
    poVar4 = std::operator<<(poVar4,' ');
    poVar4 = operator<<(poVar4,&this->SUIrect);
    std::operator<<(poVar4,'\n');
    poVar4 = std::operator<<((ostream *)&fOut,"ACInfoWndPos");
    poVar4 = std::operator<<(poVar4,' ');
    poVar4 = operator<<(poVar4,&this->ACIrect);
    std::operator<<(poVar4,'\n');
    poVar4 = std::operator<<((ostream *)&fOut,"InfoListWndPos");
    poVar4 = std::operator<<(poVar4,' ');
    poVar4 = operator<<(poVar4,&this->ILWrect);
    std::operator<<(poVar4,'\n');
    poVar4 = std::operator<<((ostream *)&fOut,"DEFAULT_AC_TYPE");
    poVar4 = std::operator<<(poVar4,' ');
    poVar4 = std::operator<<(poVar4,(string *)&this->sDefaultAcIcaoType);
    std::operator<<(poVar4,'\n');
    poVar4 = std::operator<<((ostream *)&fOut,"DEFAULT_CAR_TYPE");
    poVar4 = std::operator<<(poVar4,' ');
    poVar4 = std::operator<<(poVar4,(string *)&this->sDefaultCarIcaoType);
    std::operator<<(poVar4,'\n');
    if ((this->sOpenSkyUser)._M_string_length != 0) {
      poVar4 = std::operator<<((ostream *)&fOut,"OpenSky_User");
      poVar4 = std::operator<<(poVar4,' ');
      poVar4 = std::operator<<(poVar4,(string *)&this->sOpenSkyUser);
      std::operator<<(poVar4,'\n');
    }
    if ((this->sOpenSkyPwd)._M_string_length != 0) {
      poVar4 = std::operator<<((ostream *)&fOut,"OpenSky_Pwd");
      poVar4 = std::operator<<(poVar4,' ');
      Obfuscate((string *)sErr,&this->sOpenSkyPwd);
      poVar4 = std::operator<<(poVar4,(string *)sErr);
      std::operator<<(poVar4,'\n');
      std::__cxx11::string::~string((string *)sErr);
    }
    if ((this->sADSBExAPIKey)._M_string_length != 0) {
      poVar4 = std::operator<<((ostream *)&fOut,"ADSBEX_API_KEY");
      poVar4 = std::operator<<(poVar4,' ');
      Obfuscate((string *)sErr,&this->sADSBExAPIKey);
      poVar4 = std::operator<<(poVar4,(string *)sErr);
      std::operator<<(poVar4,'\n');
      std::__cxx11::string::~string((string *)sErr);
    }
    if ((this->sRTLicense)._M_string_length != 0) {
      poVar4 = std::operator<<((ostream *)&fOut,"RealTraffic_License");
      poVar4 = std::operator<<(poVar4,' ');
      Obfuscate((string *)sErr,&this->sRTLicense);
      poVar4 = std::operator<<(poVar4,(string *)sErr);
      std::operator<<(poVar4,'\n');
      std::__cxx11::string::~string((string *)sErr);
    }
    if ((this->sFSCUser)._M_string_length != 0) {
      poVar4 = std::operator<<((ostream *)&fOut,"FSC_User");
      poVar4 = std::operator<<(poVar4,' ');
      poVar4 = std::operator<<(poVar4,(string *)&this->sFSCUser);
      std::operator<<(poVar4,'\n');
    }
    if ((this->sFSCPwd)._M_string_length != 0) {
      poVar4 = std::operator<<((ostream *)&fOut,"FSC_Pwd");
      poVar4 = std::operator<<(poVar4,' ');
      Obfuscate((string *)sErr,&this->sFSCPwd);
      poVar4 = std::operator<<(poVar4,(string *)sErr);
      std::operator<<(poVar4,'\n');
      std::__cxx11::string::~string((string *)sErr);
    }
    if ((this->sSIDisplayName)._M_string_length != 0) {
      poVar4 = std::operator<<((ostream *)&fOut,"SI_DisplayName");
      poVar4 = std::operator<<(poVar4,' ');
      poVar4 = std::operator<<(poVar4,(string *)&this->sSIDisplayName);
      std::operator<<(poVar4,'\n');
    }
    poVar4 = std::operator<<((ostream *)&fOut,'\n');
    poVar4 = std::operator<<(poVar4,"[FlarmAcTypes]");
    std::operator<<(poVar4,'\n');
    for (lVar6 = 0; lVar6 != 0xe; lVar6 = lVar6 + 1) {
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&fOut);
      std::operator<<(poVar4," =");
      pbVar1 = dataRefs.aFlarmToIcaoAcTy._M_elems[lVar6].
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar7 = dataRefs.aFlarmToIcaoAcTy._M_elems[lVar6].
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pbVar7 != pbVar1; pbVar7 = pbVar7 + 1
          ) {
        poVar4 = std::operator<<((ostream *)&fOut,' ');
        std::operator<<(poVar4,(string *)pbVar7);
      }
      std::operator<<((ostream *)&fOut,'\n');
    }
    if ((this->vCSLPaths).
        super__Vector_base<DataRefs::CSLPathCfgTy,_std::allocator<DataRefs::CSLPathCfgTy>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (this->vCSLPaths).
        super__Vector_base<DataRefs::CSLPathCfgTy,_std::allocator<DataRefs::CSLPathCfgTy>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      poVar4 = std::operator<<((ostream *)&fOut,'\n');
      poVar4 = std::operator<<(poVar4,"[CSLPaths]");
      std::operator<<(poVar4,'\n');
      pCVar2 = (this->vCSLPaths).
               super__Vector_base<DataRefs::CSLPathCfgTy,_std::allocator<DataRefs::CSLPathCfgTy>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      for (pCVar9 = (this->vCSLPaths).
                    super__Vector_base<DataRefs::CSLPathCfgTy,_std::allocator<DataRefs::CSLPathCfgTy>_>
                    ._M_impl.super__Vector_impl_data._M_start; pCVar9 != pCVar2; pCVar9 = pCVar9 + 1
          ) {
        if ((pCVar9->path)._M_string_length != 0) {
          pcVar8 = "1|";
          if (pCVar9->bEnabled == false) {
            pcVar8 = "0|";
          }
          poVar4 = std::operator<<((ostream *)&fOut,pcVar8);
          poVar4 = std::operator<<(poVar4,(string *)&pCVar9->path);
          std::operator<<(poVar4,'\n');
        }
      }
    }
    if ((abStack_210[*(long *)(_fOut + -0x18)] & 5) == 0) {
      std::ostream::flush();
      bVar5 = true;
      std::ofstream::close();
      goto LAB_00126b5c;
    }
    piVar3 = __errno_location();
    strerror_r(*piVar3,sErr,100);
    if ((int)dataRefs.iLogLevel < 4) {
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/DataRefs.cpp"
             ,0x95b,"SaveConfigFile",logERR,"Could not write into config file \'%s\': %s",
             sFileName._M_dataplus._M_p,sErr);
    }
    CreateMsgWindow(12.0,logERR,"Could not write into config file \'%s\': %s",
                    sFileName._M_dataplus._M_p,sErr);
    std::ofstream::close();
  }
  else {
    piVar3 = __errno_location();
    strerror_r(*piVar3,sErr,100);
    if ((int)dataRefs.iLogLevel < 4) {
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/DataRefs.cpp"
             ,0x91d,"SaveConfigFile",logERR,"Could not create config file \'%s\': %s",
             sFileName._M_dataplus._M_p,sErr);
    }
    CreateMsgWindow(12.0,logERR,"Could not create config file \'%s\': %s",sFileName._M_dataplus._M_p
                    ,sErr);
  }
  bVar5 = false;
LAB_00126b5c:
  std::ofstream::~ofstream(&fOut);
  std::__cxx11::string::~string((string *)&sFileName);
  return bVar5;
}

Assistant:

bool DataRefs::SaveConfigFile()
{
    // open an output config file
    std::string sFileName (LTCalcFullPath(PATH_CONFIG_FILE));
    std::ofstream fOut (sFileName, std::ios_base::out | std::ios_base::trunc);
    if (!fOut) {
		char sErr[SERR_LEN];
		strerror_s(sErr, sizeof(sErr), errno);
		SHOW_MSG(logERR, ERR_CFG_FILE_OPEN_OUT,
                 sFileName.c_str(), sErr);
        return false;
    }
    
    // *** VERSION ***
    // save application and version first
    fOut << LIVE_TRAFFIC << ' ' << LT_VERSION << '\n';
    
    // *** DataRefs ***
    // loop over our LiveTraffic values and store those meant to be stored
    for (const DataRefs::dataRefDefinitionT& def: DATA_REFS_LT)
        if (def.isCfgFile())                   // only for values which are to be saved
            fOut << def.GetConfigString() << '\n';
    
    // *** Window positions ***
    fOut << CFG_WNDPOS_MSG << ' ' << MsgRect << '\n';
    fOut << CFG_WNDPOS_SUI << ' ' << SUIrect << '\n';
    fOut << CFG_WNDPOS_ACI << ' ' << ACIrect << '\n';
    fOut << CFG_WNDPOS_ILW << ' ' << ILWrect << '\n';
    
    // *** Strings ***
    fOut << CFG_DEFAULT_AC_TYPE << ' ' << GetDefaultAcIcaoType() << '\n';
    fOut << CFG_DEFAULT_CAR_TYPE << ' ' << GetDefaultCarIcaoType() << '\n';
    if (!sOpenSkyUser.empty())
        fOut << CFG_OPENSKY_USER << ' ' << sOpenSkyUser << '\n';
    if (!sOpenSkyPwd.empty())
        fOut << CFG_OPENSKY_PWD << ' ' << Obfuscate(sOpenSkyPwd) << '\n';
    if (!GetADSBExAPIKey().empty())
        fOut << CFG_ADSBEX_API_KEY << ' ' << Obfuscate(GetADSBExAPIKey()) << '\n';
    if (!GetRTLicense().empty())
        fOut << CFG_RT_LICENSE << ' ' << Obfuscate(GetRTLicense()) << '\n';
    if (!sFSCUser.empty())
        fOut << CFG_FSC_USER << ' ' << sFSCUser << '\n';
    if (!sFSCPwd.empty())
        fOut << CFG_FSC_PWD << ' ' << Obfuscate(sFSCPwd) << '\n';
    if (!sSIDisplayName.empty())
        fOut << CFG_SI_DISPLAYNAME << ' ' << sSIDisplayName << '\n';

    // *** [FlarmAcTypes] ***
    fOut << '\n' << CFG_FLARM_ACTY_SECTION << '\n';
    for (size_t i = 0; i < dataRefs.aFlarmToIcaoAcTy.size(); i++) {
        fOut << i << " =";
        for (const std::string& s: dataRefs.aFlarmToIcaoAcTy[i])
            fOut << ' ' << s;
        fOut << '\n';
    }

    // *** [CSLPatchs] ***
    // add section of CSL paths to the end
    if (!vCSLPaths.empty()) {
        fOut << '\n' << CFG_CSL_SECTION << '\n';
        for (const DataRefs::CSLPathCfgTy& cslPath: vCSLPaths)
            if (!cslPath.empty())
                fOut << (cslPath.enabled() ? "1|" : "0|") <<
                cslPath.getPath() << '\n';
    }
    
    // some error checking towards the end
    if (!fOut) {
        char sErr[SERR_LEN];
        strerror_s(sErr, sizeof(sErr), errno);
        SHOW_MSG(logERR, ERR_CFG_FILE_WRITE,
                 sFileName.c_str(), sErr);
        fOut.close();
        return false;
    }

    // flush (which we explicitely did not do for each line for performance reasons) and close
    fOut.flush();
    fOut.close();
        
    return true;
}